

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

bool QFileSystemEngine::mkpath
               (QFileSystemEntry *entry,optional<QFlags<QFileDevice::Permission>_> permissions)

{
  bool bVar1;
  mode_t mode;
  QFlags<QFileDevice::Permission> *pQVar2;
  QSystemError QVar3;
  int *piVar4;
  long in_FS_OFFSET;
  QMessageLogger local_68;
  QArrayDataPointer<char> local_48;
  _Optional_payload_base<QFlags<QFileDevice::Permission>_> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = (_Optional_payload_base<QFlags<QFileDevice::Permission>_>)
             permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
             _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_>;
  QFileSystemEntry::nativeFilePath((NativePath *)&local_48,entry);
  if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
    local_68.context.version = 2;
    local_68.context.function._4_4_ = 0;
    local_68.context._4_8_ = 0;
    local_68.context._12_8_ = 0;
    local_68.context.category = "default";
    QMessageLogger::warning(&local_68,"Empty filename passed to function");
  }
  else {
    bVar1 = qIsFilenameBroken((QByteArray *)&local_48);
    if (!bVar1) {
      mode = 0x1ff;
      if (((ulong)permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                  _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_> >> 0x20
          & 1) != 0) {
        pQVar2 = std::
                 _Optional_base_impl<QFlags<QFileDevice::Permission>,_std::_Optional_base<QFlags<QFileDevice::Permission>,_true,_true>_>
                 ::_M_get((_Optional_base_impl<QFlags<QFileDevice::Permission>,_std::_Optional_base<QFlags<QFileDevice::Permission>,_true,_true>_>
                           *)&local_28);
        mode = QtPrivate::toMode_t((Permissions)
                                   (pQVar2->super_QFlagsStorageHelper<QFileDevice::Permission,_4>).
                                   super_QFlagsStorage<QFileDevice::Permission>.i);
      }
      removeTrailingSlashes((QByteArray *)&local_48);
      QVar3 = createDirectoryWithParents((QByteArray *)&local_48,mode);
      bVar1 = (ulong)QVar3 >> 0x20 == 0;
      goto LAB_003737d0;
    }
    local_68.context.version = 2;
    local_68.context.function._4_4_ = 0;
    local_68.context._4_8_ = 0;
    local_68.context._12_8_ = 0;
    local_68.context.category = "default";
    QMessageLogger::warning(&local_68,"Broken filename passed to function");
  }
  piVar4 = __errno_location();
  *piVar4 = 0x16;
  bVar1 = false;
LAB_003737d0:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::mkpath(const QFileSystemEntry &entry,
                              std::optional<QFile::Permissions> permissions)
{
    QByteArray path = entry.nativeFilePath();
    Q_CHECK_FILE_NAME(path, false);

    mode_t mode = permissions ? QtPrivate::toMode_t(*permissions) : 0777;
    return createDirectoryWithParents(removeTrailingSlashes(path), mode).ok();
}